

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::
Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>::
wait(Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
     *this,void *__stat_loc)

{
  SourceLocation location;
  WaitScope *in_RDX;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
  *result_00;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
  result;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
  local_1e8;
  
  local_1e8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1e8.value.ptr.isSet = false;
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)__stat_loc,&local_1e8.super_ExceptionOrValue,in_RDX,location);
  kj::_::
  convertToReturn<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>>
            ((Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults> *)
             this,(_ *)&local_1e8,result_00);
  kj::_::
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
  ::~ExceptionOr(&local_1e8);
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}